

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O2

void duckdb_je_sec_disable(tsdn_t *tsdn,sec_t *sec)

{
  sec_shard_t *psVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0;
  for (uVar2 = 0; uVar2 < (sec->opts).nshards; uVar2 = uVar2 + 1) {
    malloc_mutex_lock(tsdn,(malloc_mutex_t *)((long)&(sec->shards->mtx).field_0 + lVar3));
    psVar1 = sec->shards;
    (&psVar1->enabled)[lVar3] = false;
    sec_flush_all_locked(tsdn,sec,(sec_shard_t *)((long)&(psVar1->mtx).field_0 + lVar3));
    psVar1 = sec->shards;
    *(undefined1 *)((long)&(psVar1->mtx).field_0 + lVar3 + 0x40) = 0;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(psVar1->mtx).field_0 + lVar3 + 0x48));
    lVar3 = lVar3 + 0x90;
  }
  return;
}

Assistant:

void
sec_disable(tsdn_t *tsdn, sec_t *sec) {
	for (size_t i = 0; i < sec->opts.nshards; i++) {
		malloc_mutex_lock(tsdn, &sec->shards[i].mtx);
		sec->shards[i].enabled = false;
		sec_flush_all_locked(tsdn, sec, &sec->shards[i]);
		malloc_mutex_unlock(tsdn, &sec->shards[i].mtx);
	}
}